

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O1

void __thiscall
ScriptUtil_CreateMultisigRedeemScriptErrorTest_Test::TestBody
          (ScriptUtil_CreateMultisigRedeemScriptErrorTest_Test *this)

{
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *this_00;
  void *pvVar1;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  pointer pMVar5;
  undefined1 *puVar6;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Pubkey> __l_00;
  initializer_list<cfd::core::Pubkey> __l_01;
  initializer_list<cfd::core::Pubkey> __l_02;
  initializer_list<MultisigTestVector> __l_03;
  vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> test_vectors;
  MultisigTestVector test_vector;
  AssertionResult gtest_ar;
  Script actual;
  allocator_type local_b8d;
  allocator_type local_b8c;
  allocator_type local_b8b;
  allocator_type local_b8a;
  allocator_type local_b89;
  string local_b88;
  Pubkey local_b68;
  Pubkey local_b50;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  string local_a38;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> local_678;
  Pubkey local_660;
  string local_648;
  undefined1 local_628 [88];
  _Alloc_hider local_5d0;
  char local_5c0 [16];
  bool local_5b0;
  undefined4 local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  Script local_588;
  undefined1 *local_550 [2];
  undefined1 local_540 [16];
  undefined1 local_530;
  undefined4 local_528;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_520;
  Script local_508;
  undefined1 *local_4d0 [2];
  undefined1 local_4c0 [16];
  undefined1 local_4b0;
  undefined4 local_4a8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_4a0;
  Script local_488;
  undefined1 *local_450 [2];
  undefined1 local_440 [16];
  undefined1 local_430;
  undefined4 local_428;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_420;
  Script local_408;
  undefined1 *local_3d0 [2];
  undefined1 local_3c0 [16];
  undefined1 local_3b0;
  undefined1 local_3a8 [72];
  Pubkey local_360;
  Pubkey local_348;
  Pubkey local_330;
  Pubkey local_318;
  Pubkey local_300;
  Pubkey local_2e8;
  Pubkey local_2d0;
  Pubkey local_2b8;
  Pubkey local_2a0;
  Pubkey local_288;
  Pubkey local_270;
  Pubkey local_258;
  Pubkey local_240;
  undefined1 local_228 [72];
  Pubkey local_1e0;
  Pubkey local_1c8;
  Pubkey local_1b0;
  Pubkey local_198;
  Pubkey local_180;
  Pubkey local_168;
  Pubkey local_150;
  Pubkey local_138;
  Pubkey local_120;
  Pubkey local_108;
  Pubkey local_f0;
  Pubkey local_d8;
  Pubkey local_c0;
  Pubkey local_a8;
  Pubkey local_90;
  Pubkey local_78;
  Pubkey local_60;
  Pubkey local_48;
  
  local_628._0_4_ = 0;
  local_b88._M_dataplus._M_p = (pointer)&local_b88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b88,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey(&local_660,&local_b88);
  __l._M_len = 1;
  __l._M_array = &local_660;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_628 + 8),__l,
             &local_b89);
  cfd::core::Script::Script((Script *)(local_628 + 0x20));
  local_5d0._M_p = local_5c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5d0,"CreateMultisigScript require_num is 0.","");
  local_5b0 = false;
  local_5a8 = 1;
  local_5a0 = 0;
  uStack_598 = 0;
  local_590 = 0;
  cfd::core::Script::Script(&local_588);
  local_550[0] = local_540;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_550,"CreateMultisigScript empty pubkey array.","");
  local_530 = 0;
  local_528 = 3;
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_698,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey(&local_b68,&local_698);
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6b8,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey(&local_b50,&local_6b8);
  __l_00._M_len = 2;
  __l_00._M_array = &local_b68;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_520,__l_00,&local_b8a);
  cfd::core::Script::Script(&local_508);
  local_4d0[0] = local_4c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4d0,"CreateMultisigScript require_num is over.","");
  local_4b0 = 0;
  local_4a8 = 1;
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6d8,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_3a8,&local_6d8);
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f8,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_3a8 + 0x18),&local_6f8);
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_718,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_3a8 + 0x30),&local_718);
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_738,
             "03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38","");
  cfd::core::Pubkey::Pubkey(&local_360,&local_738);
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_758,
             "020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1","");
  cfd::core::Pubkey::Pubkey(&local_348,&local_758);
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_778,
             "0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147","");
  cfd::core::Pubkey::Pubkey(&local_330,&local_778);
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_798,
             "0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c","");
  cfd::core::Pubkey::Pubkey(&local_318,&local_798);
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7b8,
             "020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9","");
  cfd::core::Pubkey::Pubkey(&local_300,&local_7b8);
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7d8,
             "0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37","");
  cfd::core::Pubkey::Pubkey(&local_2e8,&local_7d8);
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f8,
             "0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e","");
  cfd::core::Pubkey::Pubkey(&local_2d0,&local_7f8);
  local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_818,
             "03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b","");
  cfd::core::Pubkey::Pubkey(&local_2b8,&local_818);
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_838,
             "02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd","");
  cfd::core::Pubkey::Pubkey(&local_2a0,&local_838);
  local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_858,
             "0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d","");
  cfd::core::Pubkey::Pubkey(&local_288,&local_858);
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_878,
             "0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2","");
  cfd::core::Pubkey::Pubkey(&local_270,&local_878);
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_898,
             "025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db","");
  cfd::core::Pubkey::Pubkey(&local_258,&local_898);
  local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8b8,
             "030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55","");
  cfd::core::Pubkey::Pubkey(&local_240,&local_8b8);
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)local_3a8;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_4a0,__l_01,&local_b8b);
  cfd::core::Script::Script(&local_488);
  local_450[0] = local_440;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_450,"CreateMultisigScript pubkeys array size is over.","");
  local_430 = 0;
  local_428 = 1;
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8d8,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_228,&local_8d8);
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8f8,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_228 + 0x18),&local_8f8);
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_918,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_228 + 0x30),&local_918);
  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_938,
             "03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38","");
  cfd::core::Pubkey::Pubkey(&local_1e0,&local_938);
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_958,
             "020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1","");
  cfd::core::Pubkey::Pubkey(&local_1c8,&local_958);
  local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_978,
             "0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147","");
  cfd::core::Pubkey::Pubkey(&local_1b0,&local_978);
  local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_998,
             "0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c","");
  cfd::core::Pubkey::Pubkey(&local_198,&local_998);
  local_9b8._M_dataplus._M_p = (pointer)&local_9b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9b8,
             "020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9","");
  cfd::core::Pubkey::Pubkey(&local_180,&local_9b8);
  local_9d8._M_dataplus._M_p = (pointer)&local_9d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9d8,
             "0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37","");
  cfd::core::Pubkey::Pubkey(&local_168,&local_9d8);
  local_9f8._M_dataplus._M_p = (pointer)&local_9f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9f8,
             "0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e","");
  cfd::core::Pubkey::Pubkey(&local_150,&local_9f8);
  local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a18,
             "03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b","");
  cfd::core::Pubkey::Pubkey(&local_138,&local_a18);
  local_a38._M_dataplus._M_p = (pointer)&local_a38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a38,
             "02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd","");
  cfd::core::Pubkey::Pubkey(&local_120,&local_a38);
  local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a58,
             "0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d","");
  cfd::core::Pubkey::Pubkey(&local_108,&local_a58);
  local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a78,
             "0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2","");
  cfd::core::Pubkey::Pubkey(&local_f0,&local_a78);
  local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a98,
             "025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db","");
  cfd::core::Pubkey::Pubkey(&local_d8,&local_a98);
  local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ab8,
             "030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55","");
  cfd::core::Pubkey::Pubkey(&local_c0,&local_ab8);
  local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad8,
             "0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e","");
  cfd::core::Pubkey::Pubkey(&local_a8,&local_ad8);
  local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_af8,
             "02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8","");
  cfd::core::Pubkey::Pubkey(&local_90,&local_af8);
  local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b18,
             "03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950","");
  cfd::core::Pubkey::Pubkey(&local_78,&local_b18);
  local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b38,
             "024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561","");
  cfd::core::Pubkey::Pubkey(&local_60,&local_b38);
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_648,
             "03f3aba2366b71f8473dd8dd4186005a9e3c6f9a32f76fc45493fd2a78b78c0d8d","");
  cfd::core::Pubkey::Pubkey(&local_48,&local_648);
  __l_02._M_len = 0x15;
  __l_02._M_array = (iterator)local_228;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_420,__l_02,&local_b8c);
  cfd::core::Script::Script(&local_408);
  puVar6 = local_3c0;
  local_3d0[0] = puVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d0,"CreateMultisigScript pubkeys array size is over.","");
  local_3b0 = 1;
  __l_03._M_len = 5;
  __l_03._M_array = (iterator)local_628;
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::vector
            (&local_678,__l_03,&local_b8d);
  lVar4 = -0x280;
  do {
    if (puVar6 != *(undefined1 **)(puVar6 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar6 + -0x10));
    }
    cfd::core::Script::~Script((Script *)(puVar6 + -0x48));
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(puVar6 + -0x60));
    puVar6 = puVar6 + -0x80;
    lVar4 = lVar4 + 0x80;
  } while (lVar4 != 0);
  lVar4 = 0x1e0;
  do {
    if (*(void **)(local_228 + lVar4) != (void *)0x0) {
      operator_delete(*(void **)(local_228 + lVar4));
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
    operator_delete(local_b38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    operator_delete(local_b18._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
    operator_delete(local_af8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
    operator_delete(local_ad8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
    operator_delete(local_ab8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
    operator_delete(local_a98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
    operator_delete(local_a78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
    operator_delete(local_9f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
    operator_delete(local_9d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    operator_delete(local_998._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p);
  }
  lVar4 = 0x168;
  do {
    if (*(void **)(local_3a8 + lVar4) != (void *)0x0) {
      operator_delete(*(void **)(local_3a8 + lVar4));
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != &local_858.field_2) {
    operator_delete(local_858._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p);
  }
  lVar4 = 0x18;
  do {
    pvVar1 = *(void **)((long)&local_b68.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if (local_660.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_660.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
    operator_delete(local_b88._M_dataplus._M_p);
  }
  cfd::core::Script::Script((Script *)local_228);
  if (local_678.super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_678.super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_628 + 8);
    pMVar5 = local_678.super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_628._0_4_ = pMVar5->req_sig;
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
                (this_00,&pMVar5->input_pubkeys);
      cfd::core::Script::Script((Script *)(local_628 + 0x20),&pMVar5->expect_multisig_script);
      local_5d0._M_p = local_5c0;
      pcVar2 = (pMVar5->expect_message)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5d0,pcVar2,pcVar2 + (pMVar5->expect_message)._M_string_length);
      local_5b0 = pMVar5->is_witness;
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        cfd::core::ScriptUtil::CreateMultisigRedeemScript
                  ((Script *)local_3a8,local_628._0_4_,this_00,local_5b0);
        cfd::core::Script::operator=((Script *)local_228,(Script *)local_3a8);
        cfd::core::Script::~Script((Script *)local_3a8);
      }
      testing::Message::Message((Message *)local_3a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x18d,
                 "Expected: (actual = ScriptUtil::CreateMultisigRedeemScript( test_vector.req_sig, test_vector.input_pubkeys, test_vector.is_witness)) throws an exception of type CfdException.\n  Actual: it throws nothing."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b68,(Message *)local_3a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b68);
      if ((_func_int **)local_3a8._0_8_ != (_func_int **)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((_func_int **)local_3a8._0_8_ != (_func_int **)0x0)) {
          (**(code **)(*(_func_int **)local_3a8._0_8_ + 8))();
        }
        local_3a8._0_8_ = (_func_int **)0x0;
      }
      if (local_5d0._M_p != local_5c0) {
        operator_delete(local_5d0._M_p);
      }
      cfd::core::Script::~Script((Script *)(local_628 + 0x20));
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(this_00);
      pMVar5 = pMVar5 + 1;
    } while (pMVar5 != local_678.
                       super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  cfd::core::Script::~Script((Script *)local_228);
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::~vector(&local_678);
  return;
}

Assistant:

TEST(ScriptUtil, CreateMultisigRedeemScriptErrorTest) {
  const std::vector<MultisigTestVector> test_vectors = {
    // 0-of-1 Multisig
    {
      0,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
      },
      Script(),
      "CreateMultisigScript require_num is 0.",
      false
    },
    // 1-of-0 Multisig
    {
      1,
      {
      },
      Script(),
      "CreateMultisigScript empty pubkey array.",
      false
    },
    // 3-of-2 Multisig
    {
      3,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
      },
      Script(),
      "CreateMultisigScript require_num is over.",
      false
    },
    // 1-of-16 Multisig
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
        Pubkey("030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55"),
      },
      Script(),
      "CreateMultisigScript pubkeys array size is over.",
      false
    },
    // 1-of-21 Multisig on witness
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
        Pubkey("030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55"),
        Pubkey("0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e"),
        Pubkey("02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8"),
        Pubkey("03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950"),
        Pubkey("024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561"),
        Pubkey("03f3aba2366b71f8473dd8dd4186005a9e3c6f9a32f76fc45493fd2a78b78c0d8d"),
      },
      Script(),
      "CreateMultisigScript pubkeys array size is over.",
      true
    },
  };

  Script actual;
  for (MultisigTestVector test_vector : test_vectors) {
    try{
      EXPECT_THROW((actual = ScriptUtil::CreateMultisigRedeemScript(
          test_vector.req_sig, test_vector.input_pubkeys,
          test_vector.is_witness)), CfdException);
    } catch (CfdException &e) {
      EXPECT_STREQ(e.what(), test_vector.expect_message.c_str());
    }
  }
}